

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateFalsyObjectTest
          (Lowerer *this,Instr *insertInstr,RegOpnd *typeOpnd,TypeId typeIdToCheck,
          LabelInstr *target,LabelInstr *done,bool isNeqOp)

{
  uint32 offset;
  IndirOpnd *src1;
  IntConstOpnd *src2;
  
  if ((typeIdToCheck != TypeIds_Undefined) &&
     (this->m_func->m_threadContextInfo->wellKnownHostTypeIds[0] != typeIdToCheck)) {
    return;
  }
  offset = Js::Type::GetOffsetOfFlags();
  src1 = IR::IndirOpnd::New(typeOpnd,offset,TyInt32,this->m_func,false);
  src2 = IR::IntConstOpnd::New(2,TyInt32,this->m_func,false);
  InsertTest(&src1->super_Opnd,&src2->super_Opnd,insertInstr);
  if ((typeIdToCheck == TypeIds_Undefined) != isNeqOp) {
    done = target;
  }
  InsertBranch(BrNeq_A,true,done,insertInstr);
  return;
}

Assistant:

void
Lowerer::GenerateFalsyObjectTest(IR::Instr *insertInstr, IR::RegOpnd *typeOpnd, Js::TypeId typeIdToCheck, IR::LabelInstr* target, IR::LabelInstr* done, bool isNeqOp)
{
    if (!this->m_func->GetThreadContextInfo()->CanBeFalsy(typeIdToCheck) && typeIdToCheck != Js::TypeIds_Undefined)
    {
        // Don't need the check for falsy, the typeId we are looking for doesn't care
        return;
    }

    IR::Opnd *flagsOpnd = IR::IndirOpnd::New(typeOpnd, Js::Type::GetOffsetOfFlags(), TyInt32, this->m_func);
    InsertTest(flagsOpnd, IR::IntConstOpnd::New(TypeFlagMask_IsFalsy, TyInt32, this->m_func), insertInstr);

    if (typeIdToCheck == Js::TypeIds_Undefined)
    {
        //Falsy object returns true for undefined ((typeof falsyObj) == "undefined")
        InsertBranch( Js::OpCode::BrNeq_A, true, isNeqOp ? done : target, insertInstr);
    }
    else
    {
        //Falsy object returns false for all other types ((typeof falsyObj) != "function")
        InsertBranch( Js::OpCode::BrNeq_A, true, isNeqOp? target : done , insertInstr);
    }
}